

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O3

REF_STATUS ref_dict_create(REF_DICT *ref_dict_ptr)

{
  REF_DICT pRVar1;
  REF_INT *pRVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  pRVar1 = (REF_DICT)malloc(0x20);
  *ref_dict_ptr = pRVar1;
  if (pRVar1 == (REF_DICT)0x0) {
    pcVar4 = "malloc *ref_dict_ptr of REF_DICT_STRUCT NULL";
    uVar3 = 0x1f;
  }
  else {
    pRVar1->n = 0;
    pRVar1->max = 10;
    pRVar2 = (REF_INT *)malloc(0x28);
    pRVar1->key = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
      pcVar4 = "malloc ref_dict->key of REF_INT NULL";
      uVar3 = 0x26;
    }
    else {
      pRVar2 = (REF_INT *)malloc(0x28);
      pRVar1->value = pRVar2;
      if (pRVar2 != (REF_INT *)0x0) {
        return 0;
      }
      pcVar4 = "malloc ref_dict->value of REF_INT NULL";
      uVar3 = 0x27;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar3,
         "ref_dict_create",pcVar4);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_dict_create(REF_DICT *ref_dict_ptr) {
  REF_DICT ref_dict;

  ref_malloc(*ref_dict_ptr, 1, REF_DICT_STRUCT);

  ref_dict = (*ref_dict_ptr);

  ref_dict_n(ref_dict) = 0;
  ref_dict_max(ref_dict) = 10;

  ref_malloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
  ref_malloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);

  return REF_SUCCESS;
}